

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O1

void cf_hmac_init(cf_hmac_ctx *ctx,cf_chash *hash,uint8_t *key,size_t nkey)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  uint8_t k [128];
  uint8_t blk [128];
  byte local_128 [128];
  byte local_a8 [128];
  
  if ((ctx != (cf_hmac_ctx *)0x0) && (hash != (cf_chash *)0x0)) {
    memset(ctx,0,0x2d8);
    ctx->hash = hash;
    if (hash->blocksz < nkey) {
      if (hash->blocksz < hash->hashsz) goto LAB_00109b7b;
      cf_hash(hash,key,nkey,local_128);
      nkey = hash->hashsz;
      key = local_128;
    }
    if (local_128 != key) {
      memcpy(local_128,key,nkey);
    }
    uVar1 = hash->blocksz;
    if (nkey <= uVar1 && uVar1 - nkey != 0) {
      memset(local_128 + nkey,0,uVar1 - nkey);
    }
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        local_a8[uVar3] = local_128[uVar3] ^ 0x36;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    (*hash->init)(&ctx->inner);
    (*hash->update)(&ctx->inner,local_a8,hash->blocksz);
    sVar2 = hash->blocksz;
    if (sVar2 != 0) {
      sVar4 = 0;
      do {
        local_a8[sVar4] = local_128[sVar4] ^ 0x5c;
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
    }
    (*hash->init)(&ctx->outer);
    (*hash->update)(&ctx->outer,local_a8,hash->blocksz);
    return;
  }
LAB_00109b7b:
  abort();
}

Assistant:

void cf_hmac_init(cf_hmac_ctx *ctx,
                  const cf_chash *hash,
                  const uint8_t *key, size_t nkey)
{
  assert(ctx);
  assert(hash);

  mem_clean(ctx, sizeof *ctx);
  ctx->hash = hash;

  /* Prepare key: */
  uint8_t k[CF_CHASH_MAXBLK];

  /* Shorten long keys. */
  if (nkey > hash->blocksz)
  {
    /* Standard doesn't cover case where blocksz < hashsz.
     * FIPS186-1 seems to want to append a negative number of zero bytes.
     * In any case, we only have a k buffer of CF_CHASH_MAXBLK! */
    assert(hash->hashsz <= hash->blocksz);

    cf_hash(hash, key, nkey, k);
    key = k;
    nkey = hash->hashsz;
  }

  /* Right zero-pad short keys. */
  if (k != key)
    memcpy(k, key, nkey);
  if (hash->blocksz > nkey)
    memset(k + nkey, 0, hash->blocksz - nkey);

  /* Start inner hash computation */
  uint8_t blk[CF_CHASH_MAXBLK];

  xor_b8(blk, k, 0x36, hash->blocksz);
  hash->init(&ctx->inner);
  hash->update(&ctx->inner, blk, hash->blocksz);

  /* And outer. */
  xor_b8(blk, k, 0x5c, hash->blocksz);
  hash->init(&ctx->outer);
  hash->update(&ctx->outer, blk, hash->blocksz);

  mem_clean(blk, sizeof blk);
  mem_clean(k, sizeof k);
}